

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O0

void __thiscall mp::StringFileWriter::~StringFileWriter(StringFileWriter *this)

{
  long in_RDI;
  bool unaff_retaddr;
  function<mp::File_(bool)> *in_stack_00000008;
  
  if ((*(int *)(in_RDI + 0x34) == 0) && ((*(byte *)(in_RDI + 0x30) & 1) == 0)) {
    std::function<mp::File_(bool)>::operator()(in_stack_00000008,unaff_retaddr);
    File::~File((File *)0x116a85);
  }
  File::~File((File *)0x116a92);
  std::function<mp::File_(bool)>::~function((function<mp::File_(bool)> *)0x116a9f);
  return;
}

Assistant:

~StringFileWriter() {
    if (!cnt_ && !fTriedOpen_)  // remove file if not opened
      opener_(true);            // or nothing written
  }